

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack4_8(uint32_t *in,uint32_t *out)

{
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0xf;
  out[1] = *in >> 4 & 0xf;
  out[2] = *in >> 8 & 0xf;
  out[3] = *in >> 0xc & 0xf;
  out[4] = *in >> 0x10 & 0xf;
  out[5] = *in >> 0x14 & 0xf;
  out[6] = *in >> 0x18 & 0xf;
  out[7] = *in >> 0x1c;
  return in + 1;
}

Assistant:

const uint32_t *__fastunpack4_8(const uint32_t *__restrict__ in,
                                uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 4);
  out++;
  *out = ((*in) >> 4) % (1U << 4);
  out++;
  *out = ((*in) >> 8) % (1U << 4);
  out++;
  *out = ((*in) >> 12) % (1U << 4);
  out++;
  *out = ((*in) >> 16) % (1U << 4);
  out++;
  *out = ((*in) >> 20) % (1U << 4);
  out++;
  *out = ((*in) >> 24) % (1U << 4);
  out++;
  *out = ((*in) >> 28);
  ++in;
  out++;

  return in;
}